

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void help(void)

{
  fwrite("-s skip header\n-v version\n-z zip input\n-e [event_id from]-[event_id to] extract an inclusive range of events\n-b [FILE NAME] input bin file name\n-x [FILE NAME] input idx file name\n-h help\n"
         ,0xbb,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
		"-s skip header\n"
		"-v version\n"
		"-z zip input\n"
		"-e [event_id from]-[event_id to] extract an inclusive range of events\n"
		"-b [FILE NAME] input bin file name\n"
		"-x [FILE NAME] input idx file name\n"
		"-h help\n"
	);
}